

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::readFunctions(WasmBinaryReader *this)

{
  _Variant_storage<false,_wasm::Ok,_wasm::Err> *this_00;
  int iVar1;
  size_t sVar2;
  size_t currLocation;
  pointer puVar3;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var4;
  Module *pMVar5;
  uint uVar6;
  uint32_t uVar7;
  Unreachable *pUVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [8];
  Result<wasm::Ok> inst;
  Result<wasm::Ok> start;
  int local_40;
  
  uVar6 = getU32LEB(this);
  this->numFuncBodies = uVar6;
  if ((long)(this->wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)(this->numFuncImports + uVar6))
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"invalid function section size, must equal types",
               (allocator<char> *)
               ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    throwError(this,&local_160);
  }
  if (this->DWARF == true) {
    sVar2 = this->codeSectionLocation;
    (this->builder).binaryPos = &this->pos;
    (this->builder).codeSectionOffset = sVar2;
  }
  uVar12 = 0;
  do {
    if (uVar6 <= uVar12) {
      return;
    }
    sVar2 = this->pos;
    uVar7 = getU32LEB(this);
    if (uVar7 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"empty function size",
                 (allocator<char> *)
                 ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      throwError(this,&local_140);
    }
    currLocation = this->pos;
    uVar9 = (ulong)this->numFuncImports;
    puVar3 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         puVar3[uVar12 + uVar9]._M_t.
         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
    this->currFunction =
         (Function *)
         _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    iVar10 = (int)currLocation;
    if (this->DWARF == true) {
      iVar1 = (int)this->codeSectionLocation;
      iVar11 = iVar10 - iVar1;
      *(int *)((long)_Var4.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x1b0) =
           (int)sVar2 - iVar1;
      *(int *)((long)_Var4.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x1b4) = iVar11;
      *(uint32_t *)
       ((long)_Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
              .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x1b8) = uVar7 + iVar11;
    }
    SourceMapReader::readDebugLocationAt
              ((optional<wasm::Function::DebugLocation> *)
               ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&this->sourceMapReader,
               currLocation);
    _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         puVar3[uVar12 + uVar9]._M_t.
         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
    *(undefined8 *)
     ((long)_Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x120) =
         start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
    *(undefined8 *)
     ((long)_Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x110) =
         inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
    *(undefined8 *)
     ((long)_Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x118) =
         start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
    readVars(this);
    local_40 = (int)uVar12;
    setLocalNames(this,(Function *)
                       puVar3[uVar12 + uVar9]._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>,
                  this->numFuncImports + local_40);
    uVar13 = (ulong)(uVar7 + iVar10);
    if ((this->skipFunctionBodies == true) &&
       (pMVar5 = this->wasm,
       (long)(pMVar5->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pMVar5->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)this->startIndex)) {
      pUVar8 = MixedArena::alloc<wasm::Unreachable>(&pMVar5->allocator);
      *(Unreachable **)
       ((long)puVar3[uVar12 + uVar9]._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> + 0x60) =
           pUVar8;
      this->pos = uVar13;
    }
    else {
      this_00 = (_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      IRBuilder::visitFunctionStart
                ((Result<wasm::Ok> *)this_00,&this->builder,
                 (Function *)
                 puVar3[uVar12 + uVar9]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>);
      if (start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)&local_120,
                   (string *)
                   ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        throwError(this,&local_120);
      }
      while (this->pos < uVar13) {
        readInst((Result<wasm::Ok> *)local_a0,this);
        if (inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string((string *)&local_100,(string *)local_a0);
          throwError(this,&local_100);
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a0);
      }
      if (this->pos != uVar13) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"function overflowed its bounds",(allocator<char> *)local_a0)
        ;
        throwError(this,&local_e0);
      }
      if ((this->builder).scopeStack.
          super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->builder).scopeStack.
          super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"expected function end",(allocator<char> *)local_a0);
        throwError(this,&local_c0);
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                (this_00);
    }
    (this->sourceMapReader).hasInfo = false;
    TypeUpdating::handleNonDefaultableLocals
              ((Function *)
               puVar3[uVar12 + uVar9]._M_t.
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>,
               this->wasm);
    this->currFunction = (Function *)0x0;
    uVar12 = uVar12 + 1;
    uVar6 = this->numFuncBodies;
  } while( true );
}

Assistant:

void WasmBinaryReader::readFunctions() {
  numFuncBodies = getU32LEB();
  if (numFuncBodies + numFuncImports != wasm.functions.size()) {
    throwError("invalid function section size, must equal types");
  }
  if (DWARF) {
    builder.setBinaryLocation(&pos, codeSectionLocation);
  }
  for (size_t i = 0; i < numFuncBodies; i++) {
    auto sizePos = pos;
    size_t size = getU32LEB();
    if (size == 0) {
      throwError("empty function size");
    }
    Index endOfFunction = pos + size;

    auto& func = wasm.functions[numFuncImports + i];
    currFunction = func.get();

    if (DWARF) {
      func->funcLocation = BinaryLocations::FunctionLocations{
        BinaryLocation(sizePos - codeSectionLocation),
        BinaryLocation(pos - codeSectionLocation),
        BinaryLocation(pos - codeSectionLocation + size)};
    }

    func->prologLocation = sourceMapReader.readDebugLocationAt(pos);

    readVars();
    setLocalNames(*func, numFuncImports + i);
    {
      // Process the function body. Even if we are skipping function bodies we
      // need to not skip the start function. That contains important code for
      // wasm-emscripten-finalize in the form of pthread-related segment
      // initializations. As this is just one function, it doesn't add
      // significant time, so the optimization of skipping bodies is still very
      // useful.
      auto currFunctionIndex = wasm.functions.size();
      bool isStart = startIndex == currFunctionIndex;
      if (skipFunctionBodies && !isStart) {
        // When skipping the function body we need to put something valid in
        // their place so we validate. An unreachable is always acceptable
        // there.
        func->body = Builder(wasm).makeUnreachable();
        // Skip reading the contents.
        pos = endOfFunction;
      } else {
        auto start = builder.visitFunctionStart(func.get());
        if (auto* err = start.getErr()) {
          throwError(err->msg);
        }
        while (pos < endOfFunction) {
          auto inst = readInst();
          if (auto* err = inst.getErr()) {
            throwError(err->msg);
          }
        }
        if (pos != endOfFunction) {
          throwError("function overflowed its bounds");
        }
        if (!builder.empty()) {
          throwError("expected function end");
        }
      }
    }

    sourceMapReader.finishFunction();
    TypeUpdating::handleNonDefaultableLocals(func.get(), wasm);
    currFunction = nullptr;
  }
}